

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkDupDfsAbs(Wlc_Ntk_t *p,Vec_Int_t *vPisOld,Vec_Int_t *vPisNew,Vec_Int_t *vFlops)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  Wlc_Ntk_t *pNew_00;
  Vec_Int_t *pVVar4;
  Wlc_Obj_t *pWVar5;
  char *pcVar6;
  int nFanins;
  uint Type;
  int i;
  Vec_Int_t *vFanins;
  Wlc_Obj_t *pObj;
  Wlc_Ntk_t *pNew;
  Vec_Int_t *vFlops_local;
  Vec_Int_t *vPisNew_local;
  Vec_Int_t *vPisOld_local;
  Wlc_Ntk_t *p_local;
  
  Wlc_NtkCleanCopy(p);
  pNew_00 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  pNew_00->fSmtLib = p->fSmtLib;
  pNew_00->fAsyncRst = p->fAsyncRst;
  pNew_00->fMemPorts = p->fMemPorts;
  pNew_00->fEasyFfs = p->fEasyFfs;
  pVVar4 = Vec_IntAlloc(100);
  for (nFanins = 0; iVar2 = Vec_IntSize(vPisOld), nFanins < iVar2; nFanins = nFanins + 1) {
    iVar2 = Vec_IntEntry(vPisOld,nFanins);
    pWVar5 = Wlc_NtkObj(p,iVar2);
    iVar2 = Wlc_ObjIsPi(pWVar5);
    if (iVar2 == 0) {
      __assert_fail("Wlc_ObjIsPi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x430,
                    "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    iVar2 = Wlc_ObjId(p,pWVar5);
    Wlc_ObjDup(pNew_00,p,iVar2,pVVar4);
  }
  for (nFanins = 0; iVar2 = Vec_IntSize(vPisNew), nFanins < iVar2; nFanins = nFanins + 1) {
    iVar2 = Vec_IntEntry(vPisNew,nFanins);
    pWVar5 = Wlc_NtkObj(p,iVar2);
    uVar1 = *(ushort *)pWVar5;
    uVar3 = Wlc_ObjFaninNum(pWVar5);
    iVar2 = Wlc_ObjIsPi(pWVar5);
    if (iVar2 != 0) {
      __assert_fail("!Wlc_ObjIsPi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                    ,0x438,
                    "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                   );
    }
    *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xffc0 | 1;
    pWVar5->nFanins = 0;
    iVar2 = Wlc_ObjId(p,pWVar5);
    Wlc_ObjDup(pNew_00,p,iVar2,pVVar4);
    *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xffc0 | uVar1 & 0x3f;
    pWVar5->nFanins = uVar3;
  }
  nFanins = 0;
  while( true ) {
    iVar2 = Vec_IntSize(vFlops);
    if (iVar2 <= nFanins) {
      for (nFanins = 0; iVar2 = Wlc_NtkPoNum(p), nFanins < iVar2; nFanins = nFanins + 1) {
        pWVar5 = Wlc_NtkPo(p,nFanins);
        iVar2 = Wlc_ObjId(p,pWVar5);
        Wlc_NtkDupDfs_rec(pNew_00,p,iVar2,pVVar4);
      }
      for (nFanins = 0; iVar2 = Vec_IntSize(vFlops), nFanins < iVar2; nFanins = nFanins + 1) {
        iVar2 = Vec_IntEntry(vFlops,nFanins);
        pWVar5 = Wlc_NtkObj(p,iVar2);
        pWVar5 = Wlc_ObjFo2Fi(p,pWVar5);
        iVar2 = Wlc_ObjId(p,pWVar5);
        Wlc_NtkDupDfs_rec(pNew_00,p,iVar2,pVVar4);
      }
      for (nFanins = 0; iVar2 = Wlc_NtkPoNum(p), nFanins < iVar2; nFanins = nFanins + 1) {
        pWVar5 = Wlc_NtkPo(p,nFanins);
        pWVar5 = Wlc_ObjCopyObj(pNew_00,p,pWVar5);
        Wlc_ObjSetCo(pNew_00,pWVar5,0);
      }
      for (nFanins = 0; iVar2 = Vec_IntSize(vFlops), nFanins < iVar2; nFanins = nFanins + 1) {
        iVar2 = Vec_IntEntry(vFlops,nFanins);
        pWVar5 = Wlc_NtkObj(p,iVar2);
        pWVar5 = Wlc_ObjFo2Fi(p,pWVar5);
        pWVar5 = Wlc_ObjCopyObj(pNew_00,p,pWVar5);
        Wlc_ObjSetCo(pNew_00,pWVar5,1);
      }
      Vec_IntFree(pVVar4);
      for (nFanins = 0; iVar2 = Vec_IntSize(vFlops), nFanins < iVar2; nFanins = nFanins + 1) {
        iVar2 = Vec_IntEntry(vFlops,nFanins);
        pWVar5 = Wlc_NtkObj(p,iVar2);
        *(ushort *)pWVar5 = *(ushort *)pWVar5 & 0xff7f | 0x80;
      }
      if (p->vInits != (Vec_Int_t *)0x0) {
        pVVar4 = Wlc_ReduceMarkedInitVec(p,p->vInits);
        pNew_00->vInits = pVVar4;
      }
      if (p->pInits != (char *)0x0) {
        pcVar6 = Wlc_ReduceMarkedInitStr(p,p->pInits);
        pNew_00->pInits = pcVar6;
      }
      Wlc_NtkCleanMarks(p);
      if (p->pSpec != (char *)0x0) {
        pcVar6 = Abc_UtilStrsav(p->pSpec);
        pNew_00->pSpec = pcVar6;
      }
      return pNew_00;
    }
    iVar2 = Vec_IntEntry(vFlops,nFanins);
    pWVar5 = Wlc_NtkObj(p,iVar2);
    iVar2 = Wlc_ObjIsPi(pWVar5);
    if ((iVar2 != 0) || (iVar2 = Wlc_ObjIsCi(pWVar5), iVar2 == 0)) break;
    iVar2 = Wlc_ObjId(p,pWVar5);
    Wlc_ObjDup(pNew_00,p,iVar2,pVVar4);
    nFanins = nFanins + 1;
  }
  __assert_fail("!Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcNtk.c"
                ,0x442,
                "Wlc_Ntk_t *Wlc_NtkDupDfsAbs(Wlc_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfsAbs( Wlc_Ntk_t * p, Vec_Int_t * vPisOld, Vec_Int_t * vPisNew, Vec_Int_t * vFlops )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;

    // duplicate marked PIs
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkForEachObjVec( vPisOld, p, pObj, i )
    {
        assert( Wlc_ObjIsPi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }
    // duplicate additional PIs
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
    {
        unsigned Type = pObj->Type;
        int nFanins = Wlc_ObjFaninNum(pObj);
        assert( !Wlc_ObjIsPi(pObj) );
        pObj->Type = WLC_OBJ_PI;
        pObj->nFanins = 0;
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
        pObj->Type = Type;
        pObj->nFanins = (unsigned)nFanins;
    }
    // duplicate flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
    {
        assert( !Wlc_ObjIsPi(pObj) && Wlc_ObjIsCi(pObj) );
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    }

    // duplicate logic cones of primary outputs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    // duplidate logic cone of flop inputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, Wlc_ObjFo2Fi(p, pObj)), vFanins );

    // duplicate POs
    Wlc_NtkForEachPo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), 0 );
    // duplicate flop inputs 
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, Wlc_ObjFo2Fi(p, pObj)), 1 );
    Vec_IntFree( vFanins );

    // mark flop outputs
    Wlc_NtkForEachObjVec( vFlops, p, pObj, i )
        pObj->Mark = 1;
    if ( p->vInits )
        pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
    if ( p->pInits )
        pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
    Wlc_NtkCleanMarks( p );

    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    //Wlc_NtkTransferNames( pNew, p );
    return pNew;
}